

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall Scene::Scene(Scene *this,string *n,Decorator *dec)

{
  Decorator *dec_local;
  string *n_local;
  Scene *this_local;
  
  Observable::Observable(&this->super_Observable);
  (this->super_Observable)._vptr_Observable = (_func_int **)&PTR__Scene_00135d08;
  std::__cxx11::string::string((string *)&this->name,(string *)n);
  std::vector<Entity_*,_std::allocator<Entity_*>_>::vector(&this->entities);
  this->generateDecorator = dec;
  return;
}

Assistant:

Scene(std::string n, Decorator* dec = new Decorator) :
        name(n), generateDecorator(dec) {}